

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.c
# Opt level: O2

int advance_view(void)

{
  bool bVar1;
  int iVar2;
  
  iVar2 = 0;
  if (viewnum < 0x19) {
    iVar2 = viewnum + 1;
  }
  bVar1 = 0x18 < viewnum;
  viewnum = iVar2;
  return -(uint)bVar1;
}

Assistant:

int advance_view()
{
   int cycled = FALSE;

   viewnum++;

   if (viewnum >= (int)(sizeof(viewpos)/sizeof(VIEWPOS))) {
      viewnum = 0;
      cycled = TRUE;
   }

   return cycled;
}